

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_3dfloors.cpp
# Opt level: O3

void swrenderer::R_3D_NewClip(void)

{
  long lVar1;
  void *__dest;
  undefined8 *puVar2;
  
  __dest = M_Malloc_Dbg(0x5a10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/r_3dfloors.cpp"
                        ,100);
  *(undefined8 *)((long)__dest + 0x5a08) = 0;
  memcpy(__dest,&floorclip,0x2d00);
  memcpy((void *)((long)__dest + 0x2d00),&ceilingclip,0x2d00);
  lVar1 = fakeFloor;
  *(long *)((long)__dest + 0x5a00) = fakeFloor;
  if (*(long *)(lVar1 + 0x80) != 0) {
    __assert_fail("fakeFloor->floorclip == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/r_3dfloors.cpp"
                  ,0x69,"void swrenderer::R_3D_NewClip()");
  }
  if (*(long *)(lVar1 + 0x88) == 0) {
    *(void **)(lVar1 + 0x80) = __dest;
    *(void **)(lVar1 + 0x88) = (void *)((long)__dest + 0x2d00);
    puVar2 = (undefined8 *)((long)clip_cur + 0x5a08);
    if (clip_top == 0) {
      puVar2 = &clip_top;
    }
    *puVar2 = __dest;
    clip_cur = __dest;
    return;
  }
  __assert_fail("fakeFloor->ceilingclip == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/r_3dfloors.cpp"
                ,0x6a,"void swrenderer::R_3D_NewClip()");
}

Assistant:

void R_3D_NewClip()
{
	ClipStack *curr;
//	extern short floorclip[MAXWIDTH];
//	extern short ceilingclip[MAXWIDTH];

	curr = (ClipStack*)M_Malloc(sizeof(ClipStack));
	curr->next = 0;
	memcpy(curr->floorclip, floorclip, sizeof(short) * MAXWIDTH);
	memcpy(curr->ceilingclip, ceilingclip, sizeof(short) * MAXWIDTH);
	curr->ffloor = fakeFloor;
	assert(fakeFloor->floorclip == NULL);
	assert(fakeFloor->ceilingclip == NULL);
	fakeFloor->floorclip = curr->floorclip;
	fakeFloor->ceilingclip = curr->ceilingclip;
	if(clip_top) {
		clip_cur->next = curr;
		clip_cur = curr;
	} else {
		clip_top = clip_cur = curr;
	}
}